

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileline.c
# Opt level: O0

int tcmalloc_backtrace_syminfo
              (backtrace_state *state,uintptr_t pc,backtrace_syminfo_callback callback,
              backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  void *data_local;
  backtrace_error_callback error_callback_local;
  backtrace_syminfo_callback callback_local;
  uintptr_t pc_local;
  backtrace_state *state_local;
  
  iVar1 = fileline_initialize(state,error_callback,data);
  if (iVar1 == 0) {
    state_local._4_4_ = 0;
  }
  else if (state->fileline_initialization_failed == 0) {
    (*state->syminfo_fn)(state,pc,callback,error_callback,data);
    state_local._4_4_ = 1;
  }
  else {
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

int
backtrace_syminfo (struct backtrace_state *state, uintptr_t pc,
		   backtrace_syminfo_callback callback,
		   backtrace_error_callback error_callback, void *data)
{
  if (!fileline_initialize (state, error_callback, data))
    return 0;

  if (state->fileline_initialization_failed)
    return 0;

  state->syminfo_fn (state, pc, callback, error_callback, data);
  return 1;
}